

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_core.hpp
# Opt level: O2

__pid_t __thiscall
boost::threadpool::detail::
pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
::wait(pool_core<boost::function0<void>,_boost::threadpool::fifo_scheduler,_boost::threadpool::static_size,_boost::threadpool::resize_controller,_boost::threadpool::wait_for_all_tasks>
       *this,void *__stat_loc)

{
  size_t sVar1;
  __pid_t extraout_EAX;
  size_type sVar2;
  scoped_lock lock;
  unique_lock<boost::recursive_mutex> local_40;
  
  unique_lock<boost::recursive_mutex>::unique_lock(&local_40,&this->m_monitor);
  if (__stat_loc == (void *)0x0) {
    while ((this->m_active_worker_count != 0 ||
           ((this->m_scheduler).m_container.
            super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur !=
            (this->m_scheduler).m_container.
            super__Deque_base<boost::function0<void>,_std::allocator<boost::function0<void>_>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur))) {
      condition_variable_any::wait<boost::unique_lock<boost::recursive_mutex>>
                (&this->m_worker_idle_or_terminated_event,&local_40);
    }
  }
  else {
    while( true ) {
      sVar1 = this->m_active_worker_count;
      sVar2 = std::deque<boost::function0<void>,_std::allocator<boost::function0<void>_>_>::size
                        (&(this->m_scheduler).m_container);
      if ((void *)(sVar2 + sVar1) <= __stat_loc) break;
      condition_variable_any::wait<boost::unique_lock<boost::recursive_mutex>>
                (&this->m_worker_idle_or_terminated_event,&local_40);
    }
  }
  unique_lock<boost::recursive_mutex>::~unique_lock(&local_40);
  return extraout_EAX;
}

Assistant:

void wait(size_t const task_threshold = 0) const volatile
    {
      const pool_type* self = const_cast<const pool_type*>(this);
      recursive_mutex::scoped_lock lock(self->m_monitor);

      if(0 == task_threshold)
      {
        while(0 != self->m_active_worker_count || !self->m_scheduler.empty())
        { 
          self->m_worker_idle_or_terminated_event.wait(lock);
        }
      }
      else
      {
        while(task_threshold < self->m_active_worker_count + self->m_scheduler.size())
        { 
          self->m_worker_idle_or_terminated_event.wait(lock);
        }
      }
    }